

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

shared_ptr<duckdb::ColumnStatistics,_true> __thiscall
duckdb::Deserializer::List::ReadElement<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
          (List *this)

{
  Deserializer *deserializer;
  Deserializer *this_00;
  Deserializer *pDVar1;
  Deserializer *pDVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<duckdb::ColumnStatistics,_true> sVar4;
  Deserializer *local_28;
  Deserializer *pDStack_20;
  
  deserializer = (Deserializer *)*in_RSI;
  this->deserializer = (Deserializer *)0x0;
  this[1].deserializer = (Deserializer *)0x0;
  iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar3 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    ColumnStatistics::Deserialize((ColumnStatistics *)&local_28,deserializer);
    pDVar2 = pDStack_20;
    pDVar1 = local_28;
    local_28 = (Deserializer *)0x0;
    pDStack_20 = (Deserializer *)0x0;
    this_00 = this[1].deserializer;
    this->deserializer = pDVar1;
    this[1].deserializer = pDVar2;
    if (this_00 != (Deserializer *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (pDStack_20 != (Deserializer *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pDStack_20);
    }
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  sVar4.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ColumnStatistics,_true>)
         sVar4.internal.super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Deserializer::List::ReadElement() {
	return deserializer.Read<T>();
}